

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O3

void archive_entry_xattr_clear(archive_entry *entry)

{
  ae_xattr *paVar1;
  ae_xattr *paVar2;
  
  paVar2 = entry->xattr_head;
  while (paVar2 != (ae_xattr *)0x0) {
    paVar1 = paVar2->next;
    free(paVar2->name);
    free(entry->xattr_head->value);
    free(entry->xattr_head);
    entry->xattr_head = paVar1;
    paVar2 = paVar1;
  }
  entry->xattr_head = (ae_xattr *)0x0;
  return;
}

Assistant:

void
archive_entry_xattr_clear(struct archive_entry *entry)
{
	struct ae_xattr	*xp;

	while (entry->xattr_head != NULL) {
		xp = entry->xattr_head->next;
		free(entry->xattr_head->name);
		free(entry->xattr_head->value);
		free(entry->xattr_head);
		entry->xattr_head = xp;
	}

	entry->xattr_head = NULL;
}